

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O1

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,Graph *g)

{
  pointer ppVar1;
  pointer ppVar2;
  Expression *pEVar3;
  VariableDeclaration *pVVar4;
  int iVar5;
  pointer ppVar6;
  pointer ppVar7;
  GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
  GStack_68;
  CompileMessage local_50;
  
  ASTVisitor::visit(&this->super_ASTVisitor,g);
  ppVar1 = (g->super_ProcessorBase).endpoints.
           super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar6 = (g->super_ProcessorBase).endpoints.
                super__Vector_base<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar1; ppVar6 = ppVar6 + 1) {
    checkEndpointDataTypes(ppVar6->object);
  }
  ppVar7 = (g->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (g->constants).
           super__Vector_base<soul::pool_ref<soul::AST::VariableDeclaration>,_std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppVar7 == ppVar2) {
      RecursiveGraphDetector::check(g,(RecursiveGraphDetector *)0x0);
      visit(soul::AST::Graph&)::CycleDetector::CycleDetector(soul::AST::Graph__(&GStack_68,g);
      heart::Utilities::
      GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
      ::checkAndThrowErrorIfCycleFound(&GStack_68);
      std::
      vector<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node,_std::allocator<soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node>_>
      ::~vector(&GStack_68.nodes);
      return;
    }
    if (ppVar7->object->isConstant != true) break;
    pEVar3 = (ppVar7->object->initialValue).object;
    if (pEVar3 != (Expression *)0x0) {
      iVar5 = (*(pEVar3->super_Statement).super_ASTObject._vptr_ASTObject[0xe])();
      if ((char)iVar5 == '\0') break;
    }
    ppVar7 = ppVar7 + 1;
  }
  pVVar4 = ppVar7->object;
  CompileMessageHelpers::createMessage<>
            (&local_50,syntax,error,"Only constant variables can be declared inside a graph");
  AST::Context::throwError(&(pVVar4->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::Graph& g) override
        {
            super::visit (g);

            for (auto input : g.endpoints)
                checkEndpointDataTypes (input.get());

            for (auto& v : g.constants)
                if (! v->isCompileTimeConstant())
                    v->context.throwError (Errors::nonConstInGraph());

            RecursiveGraphDetector::check (g);

            struct CycleDetector  : public heart::Utilities::GraphTraversalHelper<CycleDetector, AST::ProcessorInstance, AST::Connection, AST::Context>
            {
                CycleDetector (AST::Graph& graph)
                {
                    reserve (graph.processorInstances.size());

                    for (auto& p : graph.processorInstances)
                        addNode (p);

                    for (auto& c : graph.connections)
                        if (c->delayLength == nullptr)
                            if (auto src = c->getSourceProcessor())
                                if (auto dst = c->getDestProcessor())
                                    addConnection (*src, *dst, c);
                }

                static std::string getProcessorName (const AST::ProcessorInstance& p)  { return p.getReadableName(); }
                static const AST::Context& getContext (const AST::Connection& c)       { return c.context; }
            };

            CycleDetector (g).checkAndThrowErrorIfCycleFound();
        }